

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O1

void CreateMsgWindow(float fTimeToDisplay,int numSee,int numShow,int bufTime)

{
  int iVar1;
  _Node *p_Var2;
  bool bVar3;
  unique_lock<std::recursive_mutex> lock;
  char aszMsgTxt [500];
  logLevelTy local_270;
  float local_26c;
  unique_lock<std::recursive_mutex> local_268;
  float local_258;
  long *local_248 [2];
  long local_238 [2];
  char local_228 [504];
  
  local_268._M_device = &gListMutex;
  local_268._M_owns = false;
  local_258 = fTimeToDisplay;
  std::unique_lock<std::recursive_mutex>::lock(&local_268);
  local_268._M_owns = true;
  if (listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node
      .super__List_node_base._M_next == (_List_node_base *)&listTexts_abi_cxx11_) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr
              ((ulong)local_248,
               (ulong)&listTexts_abi_cxx11_.
                       super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node.
                       super__List_node_base._M_next[1]._M_prev);
    iVar1 = std::__cxx11::string::compare((char *)local_248);
    bVar3 = iVar1 == 0;
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
  }
  if (bVar3) {
    std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::_M_erase
              (&listTexts_abi_cxx11_,
               (iterator)
               listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>.
               _M_impl._M_node.super__List_node_base._M_next);
  }
  if (-1 < bufTime) {
    snprintf(local_228,500,"Filling buffer: seeing %d aircraft, displaying %d, still %ds to buffer",
             (ulong)(uint)numSee,numShow,(ulong)(uint)bufTime);
    local_26c = -local_258;
    local_270 = logINFO;
    p_Var2 = std::__cxx11::list<dispTextTy,std::allocator<dispTextTy>>::
             _M_create_node<float,logLevelTy,char(&)[500]>
                       ((list<dispTextTy,std::allocator<dispTextTy>> *)&listTexts_abi_cxx11_,
                        &local_26c,&local_270,(char (*) [500])local_228);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node.
    _M_size = listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl
              ._M_node._M_size + 1;
  }
  WndMsg::DoShow();
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_268);
  return;
}

Assistant:

void CreateMsgWindow(float fTimeToDisplay, int numSee, int numShow, int bufTime)
{
    // This entry shall always be the first one in the list
    // So let's see if it is already the first one, then we'd remove it first
    std::unique_lock<std::recursive_mutex> lock(gListMutex);
    if (!listTexts.empty() && listTexts.front().text.substr(0,23) == MSG_BUF_FILL_BEGIN)
        listTexts.pop_front();
    
    // Now create the actual message if there is anything to show
    if (bufTime >= 0) {
        char aszMsgTxt[500];
        snprintf(aszMsgTxt, sizeof(aszMsgTxt), MSG_BUF_FILL_COUNTDOWN,
                 numSee, numShow, bufTime);
        // add to list of display texts _at front_
        listTexts.emplace_front(-fTimeToDisplay, logINFO, aszMsgTxt);
    }
    
    // Show the window
    WndMsg::DoShow();
}